

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_keyexpimp.c
# Opt level: O3

int kuznyechik_wrap_do(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  int iVar1;
  int iVar2;
  uchar *iv;
  size_t expkeylen;
  
  iv = (uchar *)EVP_CIPHER_CTX_get_cipher_data();
  iVar1 = EVP_CIPHER_CTX_is_encrypting(ctx);
  if (out == (uchar *)0x0) {
    iVar2 = 0x20;
  }
  else {
    expkeylen = *(size_t *)(iv + 0x78);
    if (inl < 0x31) {
      if (0x30 < expkeylen + inl) {
        return -1;
      }
      memcpy(iv + expkeylen + 0x48,in,inl);
      expkeylen = inl + *(long *)(iv + 0x78);
      *(size_t *)(iv + 0x78) = expkeylen;
    }
    iVar2 = (expkeylen < 0x30) - 1;
    if ((0x2f < expkeylen) && (iVar1 == 0)) {
      iVar1 = gost_kimp15(iv + 0x48,expkeylen,0x3f5,iv + 0x28,0x3f9,iv + 8,iv,8,out);
      iVar2 = (uint)(iVar1 != 0) << 5;
    }
  }
  return iVar2;
}

Assistant:

static int kuznyechik_wrap_do(EVP_CIPHER_CTX *ctx, unsigned char *out,
	const unsigned char *in, size_t inl)
{
	GOST_WRAP_CTX *cctx = EVP_CIPHER_CTX_get_cipher_data(ctx);
	int enc = EVP_CIPHER_CTX_encrypting(ctx) ? 1 : 0;

	if (out == NULL)
		return GOSTKEYLEN;

	if (inl <= KUZNYECHIK_WRAPPED_KEY_LEN) {
		if (cctx->wrap_count + inl > KUZNYECHIK_WRAPPED_KEY_LEN)
			return -1;

		if (cctx->wrap_count + inl <= KUZNYECHIK_WRAPPED_KEY_LEN)
		{
			memcpy(cctx->wrapped+cctx->wrap_count, in, inl);
			cctx->wrap_count += inl;
		}
	}

	if (cctx->wrap_count < KUZNYECHIK_WRAPPED_KEY_LEN)
		return 0;

	if (enc) {
#if 0
		return gost_kexp15(cctx->key, 32, NID_magma_ctr, in, NID_magma_mac,
			cctx->key, /* FIXME mac_key, */ cctx->iv, 4, out, &outl);
#endif
		return -1;
	} else {
		return gost_kimp15(cctx->wrapped, cctx->wrap_count, NID_kuznyechik_ctr,
		cctx->key+GOSTKEYLEN, NID_kuznyechik_mac, cctx->key, cctx->iv, 8, out) > 0 ? GOSTKEYLEN : 0;
	}
}